

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void Commands::HideImpl(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Character *from,bool set)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  pointer pbVar4;
  uint unsetflags;
  pointer pbVar5;
  bool bVar6;
  string local_b8;
  undefined4 local_94;
  pointer local_90;
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,",","");
  util::lowercase(&local_50,
                  (arguments->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
  util::explode(&local_68,&local_b8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_94 = (undefined4)CONCAT71(in_register_00000011,set);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  bVar6 = local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (bVar6) {
    unsetflags = 0;
  }
  else {
    unsetflags = 0;
    pbVar4 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar2 = std::__cxx11::string::compare((char *)pbVar5);
      if (iVar2 == 0) {
        uVar3 = 1;
LAB_0012d3c7:
        unsetflags = unsetflags | uVar3 | ((unsetflags | uVar3) & 0xfffffffe) << 0x10;
        bVar1 = true;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)pbVar5);
        if (iVar2 == 0) {
          uVar3 = 2;
          goto LAB_0012d3c7;
        }
        iVar2 = std::__cxx11::string::compare((char *)pbVar5);
        if (iVar2 == 0) {
          uVar3 = 4;
          goto LAB_0012d3c7;
        }
        iVar2 = std::__cxx11::string::compare((char *)pbVar5);
        if (iVar2 == 0) {
          uVar3 = 8;
          goto LAB_0012d3c7;
        }
        iVar2 = std::__cxx11::string::compare((char *)pbVar5);
        if (iVar2 == 0) {
          uVar3 = 0x10;
          goto LAB_0012d3c7;
        }
        iVar2 = std::__cxx11::string::compare((char *)pbVar5);
        if (iVar2 == 0) {
          uVar3 = 0x1f;
          goto LAB_0012d3c7;
        }
        local_90 = pbVar4;
        iVar2 = (*(from->super_Command_Source)._vptr_Command_Source[4])();
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"invalid_hide_flag","");
        I18N::Format<>(&local_88,(I18N *)(CONCAT44(extraout_var,iVar2) + 0x490),&local_b8);
        (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        bVar1 = false;
        pbVar4 = local_90;
      }
      if (!bVar1) break;
      pbVar5 = pbVar5 + 1;
      bVar6 = pbVar5 == pbVar4;
    } while (!bVar6);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if (bVar6) {
    if ((char)local_94 == '\0') {
      Character::Unhide(from,unsetflags);
    }
    else {
      Character::Hide(from,unsetflags);
    }
  }
  return;
}

Assistant:

void HideImpl(const std::vector<std::string>& arguments, Character* from, bool set)
{
	int flags = 0;

	for (const auto& flag : util::explode(",", util::lowercase(arguments[0])))
	{
		     if (flag == "invisible") flags |= Character::HideInvisible;
		else if (flag == "online")    flags |= Character::HideOnline;
		else if (flag == "npc")       flags |= Character::HideNpc;
		else if (flag == "admin")     flags |= Character::HideAdmin;
		else if (flag == "warp")      flags |= Character::HideWarp;
		else if (flag == "all")       flags |= Character::HideAll;
		else
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_hide_flag"));
			return;
		}

		int explicit_flags = (flags & ~Character::HideInvisible) << 16;
		flags |= explicit_flags;
	}

	if (set)
		from->Hide(flags);
	else
		from->Unhide(flags);
}